

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

ArrayPtr<const_kj::(anonymous_namespace)::HttpResponseTestCase>
kj::anon_unknown_0::responseTestCases(void)

{
  initializer_list<kj::StringPtr> init;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_00;
  initializer_list<kj::StringPtr> init_01;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_02;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_03;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_04;
  initializer_list<kj::StringPtr> init_05;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init_06;
  int iVar1;
  size_t size;
  ArrayPtr<const_kj::(anonymous_namespace)::HttpResponseTestCase> AVar2;
  StringPtr local_460;
  StringPtr local_450;
  iterator local_440;
  undefined8 local_438;
  InitializeableArray<kj::StringPtr> local_430;
  Maybe<unsigned_long> local_418;
  HeaderTestCase local_408;
  iterator local_3e8;
  undefined8 local_3e0;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_3d8;
  ArrayPtr<const_char> local_3c0;
  ArrayPtr<const_char> local_3b0;
  StringPtr local_3a0;
  StringPtr local_390;
  iterator local_380;
  undefined8 local_378;
  InitializeableArray<kj::StringPtr> local_370;
  unsigned_long local_358;
  Maybe<unsigned_long> local_350;
  HeaderTestCase local_340;
  iterator local_320;
  undefined8 local_318;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_310;
  ArrayPtr<const_char> local_2f8;
  ArrayPtr<const_char> local_2e8;
  initializer_list<kj::StringPtr> local_2d8;
  InitializeableArray<kj::StringPtr> local_2c8;
  unsigned_long local_2b0;
  Maybe<unsigned_long> local_2a8;
  initializer_list<kj::(anonymous_namespace)::HeaderTestCase> local_298;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_288;
  ArrayPtr<const_char> local_270;
  ArrayPtr<const_char> local_260;
  initializer_list<kj::StringPtr> local_250;
  InitializeableArray<kj::StringPtr> local_240;
  unsigned_long local_228;
  Maybe<unsigned_long> local_220;
  HeaderTestCase local_210;
  undefined8 local_1f0;
  undefined4 local_1e8;
  StringPtr local_1e0;
  iterator local_1d0;
  undefined8 local_1c8;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_1c0;
  ArrayPtr<const_char> local_1a8;
  ArrayPtr<const_char> local_198;
  initializer_list<kj::StringPtr> local_188;
  InitializeableArray<kj::StringPtr> local_178;
  unsigned_long local_160;
  Maybe<unsigned_long> local_158;
  HeaderTestCase local_148;
  iterator local_128;
  undefined8 local_120;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_118;
  ArrayPtr<const_char> local_100;
  ArrayPtr<const_char> local_f0;
  StringPtr local_e0;
  iterator local_d0;
  undefined8 local_c8;
  InitializeableArray<kj::StringPtr> local_c0;
  Maybe<unsigned_long> local_a8;
  HeaderTestCase local_98;
  iterator local_78;
  undefined8 local_70;
  InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> local_68;
  ArrayPtr<const_char> local_50 [2];
  ArrayPtr<const_char> local_30;
  HttpResponseTestCase *local_20;
  
  if ((anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES);
    if (iVar1 != 0) {
      local_20 = responseTestCases::RESPONSE_TEST_CASES;
      StringPtr::StringPtr
                ((StringPtr *)&local_30,
                 "HTTP/1.1 200 OK\r\nContent-Type: text/plain\r\nConnection: close\r\n\r\nbaz qux");
      StringPtr::StringPtr((StringPtr *)local_50,"OK");
      local_98.id.id = 0xe;
      local_98.id.table = (HttpHeaderTable *)0x0;
      StringPtr::StringPtr(&local_98.value,"text/plain");
      local_78 = &local_98;
      local_70 = 1;
      init_06._M_len = 1;
      init_06._M_array = local_78;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_68,init_06);
      Maybe<unsigned_long>::Maybe(&local_a8,(void *)0x0);
      StringPtr::StringPtr(&local_e0,"baz qux");
      local_d0 = &local_e0;
      local_c8 = 1;
      init_05._M_len = 1;
      init_05._M_array = local_d0;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_c0,init_05);
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES,(StringPtr)local_30,200,
                 (StringPtr)local_50[0],&local_68,&local_a8,&local_c0,GET,CLIENT_ONLY);
      local_20 = (HttpResponseTestCase *)0x7e4e80;
      StringPtr::StringPtr
                ((StringPtr *)&local_f0,
                 "HTTP/1.1 200 OK\r\nContent-Length: 123\r\nContent-Type: text/plain\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_100,"OK");
      local_148.id.id = 0xe;
      local_148.id.table = (HttpHeaderTable *)0x0;
      StringPtr::StringPtr(&local_148.value,"text/plain");
      local_128 = &local_148;
      local_120 = 1;
      init_04._M_len = 1;
      init_04._M_array = local_128;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_118,init_04);
      local_160 = 0x7b;
      Maybe<unsigned_long>::Maybe(&local_158,&local_160);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_188);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_178,local_188);
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 1,(StringPtr)local_f0,200,
                 (StringPtr)local_100,&local_118,&local_158,&local_178,HEAD,BOTH);
      local_20 = (HttpResponseTestCase *)0x7e4ef0;
      StringPtr::StringPtr
                ((StringPtr *)&local_198,
                 "HTTP/1.1 200 OK\r\nContent-Length: foobar\r\nContent-Type: text/plain\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_1a8,"OK");
      local_210.id.id = 0xe;
      local_210.id.table = (HttpHeaderTable *)0x0;
      StringPtr::StringPtr(&local_210.value,"text/plain");
      local_1e8 = 5;
      local_1f0 = 0;
      StringPtr::StringPtr(&local_1e0,"foobar");
      local_1d0 = &local_210;
      local_1c8 = 2;
      init_03._M_len = 2;
      init_03._M_array = local_1d0;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_1c0,init_03);
      local_228 = 0x7b;
      Maybe<unsigned_long>::Maybe(&local_220,&local_228);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_250);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_240,local_250);
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 2,(StringPtr)local_198,200,
                 (StringPtr)local_1a8,&local_1c0,&local_220,&local_240,HEAD,BOTH);
      local_20 = (HttpResponseTestCase *)0x7e4f60;
      StringPtr::StringPtr((StringPtr *)&local_260,"HTTP/1.1 200 OK\r\n\r\n");
      StringPtr::StringPtr((StringPtr *)&local_270,"OK");
      std::initializer_list<kj::(anonymous_namespace)::HeaderTestCase>::initializer_list(&local_298)
      ;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_288,local_298);
      local_2b0 = 0;
      Maybe<unsigned_long>::Maybe(&local_2a8,&local_2b0);
      std::initializer_list<kj::StringPtr>::initializer_list(&local_2d8);
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_2c8,local_2d8);
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 3,(StringPtr)local_260,200,
                 (StringPtr)local_270,&local_288,&local_2a8,&local_2c8,HEAD,BOTH);
      local_20 = (HttpResponseTestCase *)0x7e4fd0;
      StringPtr::StringPtr
                ((StringPtr *)&local_2e8,
                 "HTTP/1.1 200 OK\r\nContent-Length: 8\r\nContent-Type: text/plain\r\n\r\nquxcorge")
      ;
      StringPtr::StringPtr((StringPtr *)&local_2f8,"OK");
      local_340.id.id = 0xe;
      local_340.id.table = (HttpHeaderTable *)0x0;
      StringPtr::StringPtr(&local_340.value,"text/plain");
      local_320 = &local_340;
      local_318 = 1;
      init_02._M_len = 1;
      init_02._M_array = local_320;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_310,init_02);
      local_358 = 8;
      Maybe<unsigned_long>::Maybe(&local_350,&local_358);
      StringPtr::StringPtr(&local_3a0,"qux");
      StringPtr::StringPtr(&local_390,"corge");
      local_380 = &local_3a0;
      local_378 = 2;
      init_01._M_len = 2;
      init_01._M_array = local_380;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_370,init_01);
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 4,(StringPtr)local_2e8,200,
                 (StringPtr)local_2f8,&local_310,&local_350,&local_370,GET,BOTH);
      local_20 = (HttpResponseTestCase *)0x7e5040;
      StringPtr::StringPtr
                ((StringPtr *)&local_3b0,
                 "HTTP/1.1 200 OK\r\nTransfer-Encoding: chunked\r\nContent-Type: text/plain\r\n\r\n3\r\nqux\r\n5\r\ncorge\r\n0\r\n\r\n"
                );
      StringPtr::StringPtr((StringPtr *)&local_3c0,"OK");
      local_408.id.id = 0xe;
      local_408.id.table = (HttpHeaderTable *)0x0;
      StringPtr::StringPtr(&local_408.value,"text/plain");
      local_3e8 = &local_408;
      local_3e0 = 1;
      init_00._M_len = 1;
      init_00._M_array = local_3e8;
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::InitializeableArray
                (&local_3d8,init_00);
      Maybe<unsigned_long>::Maybe(&local_418,(void *)0x0);
      StringPtr::StringPtr(&local_460,"qux");
      StringPtr::StringPtr(&local_450,"corge");
      local_440 = &local_460;
      local_438 = 2;
      init._M_len = 2;
      init._M_array = local_440;
      InitializeableArray<kj::StringPtr>::InitializeableArray(&local_430,init);
      HttpResponseTestCase::HttpResponseTestCase
                (responseTestCases::RESPONSE_TEST_CASES + 5,(StringPtr)local_3b0,200,
                 (StringPtr)local_3c0,&local_3d8,&local_418,&local_430,GET,BOTH);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_430);
      Maybe<unsigned_long>::~Maybe(&local_418);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_3d8);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_370);
      Maybe<unsigned_long>::~Maybe(&local_350);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_310);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_2c8);
      Maybe<unsigned_long>::~Maybe(&local_2a8);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_288);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_240);
      Maybe<unsigned_long>::~Maybe(&local_220);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_1c0);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_178);
      Maybe<unsigned_long>::~Maybe(&local_158);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_118);
      InitializeableArray<kj::StringPtr>::~InitializeableArray(&local_c0);
      Maybe<unsigned_long>::~Maybe(&local_a8);
      InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::~InitializeableArray
                (&local_68);
      __cxa_atexit(__cxx_global_array_dtor_484,0,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::responseTestCases()::RESPONSE_TEST_CASES);
    }
  }
  size = size<kj::(anonymous_namespace)::HttpResponseTestCase_const,6ul>
                   (&responseTestCases::RESPONSE_TEST_CASES);
  AVar2 = arrayPtr<kj::(anonymous_namespace)::HttpResponseTestCase_const>
                    (responseTestCases::RESPONSE_TEST_CASES,size);
  return AVar2;
}

Assistant:

kj::ArrayPtr<const HttpResponseTestCase> responseTestCases() {
  static const HttpResponseTestCase RESPONSE_TEST_CASES[] {
    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Type: text/plain\r\n"
      "Connection: close\r\n"
      "\r\n"
      "baz qux",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      nullptr, {"baz qux"},

      HttpMethod::GET,
      CLIENT_ONLY,   // Server never sends connection: close
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: 123\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      123, {},

      HttpMethod::HEAD,
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: foobar\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"},
       {HttpHeaderId::CONTENT_LENGTH, "foobar"}},
      123, {},

      HttpMethod::HEAD,
    },

    // Zero-length expected size response to HEAD request has no Content-Length header.
    {
      "HTTP/1.1 200 OK\r\n"
      "\r\n",

      200, "OK",
      {},
      uint64_t(0), {},

      HttpMethod::HEAD,
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Content-Length: 8\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n"
      "quxcorge",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      8, { "qux", "corge" }
    },

    {
      "HTTP/1.1 200 OK\r\n"
      "Transfer-Encoding: chunked\r\n"
      "Content-Type: text/plain\r\n"
      "\r\n"
      "3\r\n"
      "qux\r\n"
      "5\r\n"
      "corge\r\n"
      "0\r\n"
      "\r\n",

      200, "OK",
      {{HttpHeaderId::CONTENT_TYPE, "text/plain"}},
      nullptr, { "qux", "corge" }
    },
  };

  // TODO(cleanup): A bug in GCC 4.8, fixed in 4.9, prevents RESPONSE_TEST_CASES from implicitly
  //   casting to our return type.
  return kj::arrayPtr(RESPONSE_TEST_CASES, kj::size(RESPONSE_TEST_CASES));
}